

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

value_type * __thiscall
QList<Symbol>::takeLast(value_type *__return_storage_ptr__,QList<Symbol> *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  Token TVar4;
  iterator iVar5;
  
  __return_storage_ptr__->from = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->len = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->lex).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->lex).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->lex).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  iVar5 = end(this);
  TVar4 = iVar5.i[-1].token;
  __return_storage_ptr__->lineNum = iVar5.i[-1].lineNum;
  __return_storage_ptr__->token = TVar4;
  pDVar2 = iVar5.i[-1].lex.d.d;
  pcVar3 = iVar5.i[-1].lex.d.ptr;
  iVar5.i[-1].lex.d.d = (Data *)0x0;
  iVar5.i[-1].lex.d.ptr = (char *)0x0;
  (__return_storage_ptr__->lex).d.d = pDVar2;
  (__return_storage_ptr__->lex).d.ptr = pcVar3;
  qVar1 = iVar5.i[-1].lex.d.size;
  iVar5.i[-1].lex.d.size = 0;
  (__return_storage_ptr__->lex).d.size = qVar1;
  qVar1 = iVar5.i[-1].len;
  __return_storage_ptr__->from = iVar5.i[-1].from;
  __return_storage_ptr__->len = qVar1;
  QtPrivate::QGenericArrayOps<Symbol>::eraseLast((QGenericArrayOps<Symbol> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }